

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall Thread::Thread(Thread *this,ThreadFunc *func,string *name)

{
  MutexLock *__mutex;
  pointer pcVar1;
  
  this->started_ = false;
  this->joined_ = false;
  this->pthreadId_ = 0;
  this->tid_ = 0;
  std::function<void_()>::function(&this->func_,func);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  __mutex = &(this->latch_).mutex_;
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  (this->latch_).condition_.mutex = __mutex;
  pthread_cond_init((pthread_cond_t *)&(this->latch_).condition_.cond,(pthread_condattr_t *)0x0);
  (this->latch_).count_ = 1;
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(const ThreadFunc& func, const std::string& name)
    : started_(false),
    joined_(false),
    pthreadId_(0),
    tid_(0),
    func_(func),
    name_(name),
    latch_(1) {
    setDefaultName();   
}